

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

void __thiscall pstore::file::file_handle::file_handle(file_handle *this,string *path)

{
  (this->super_file_base)._vptr_file_base = (_func_int **)&PTR__file_handle_00135898;
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  this->file_ = -1;
  this->is_writable_ = false;
  return;
}

Assistant:

explicit file_handle (std::string path) noexcept
                    : path_{std::move (path)} {}